

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaPResCompAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr ownerElem,char *name,xmlChar *refName,xmlChar *refURI,
               xmlSchemaTypeType refType,char *refTypeStr)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  undefined4 in_register_00000034;
  char *file;
  int line;
  undefined4 in_stack_00000014;
  xmlChar *des;
  int in_stack_ffffffffffffff80;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlSchemaParserCtxtPtr local_38;
  
  line = (int)refName;
  pxVar2 = (xmlChar *)CONCAT44(in_stack_00000014,refType);
  local_48 = (xmlChar *)0x0;
  local_40 = (xmlChar *)0x0;
  file = name;
  local_38 = ctxt;
  xmlSchemaFormatItemForReport
            (&local_48,(xmlChar *)CONCAT44(in_register_00000034,error),ownerItem,ownerElem);
  if (pxVar2 == (xmlChar *)0x0) {
    pxVar2 = xmlSchemaItemTypeToStr((xmlSchemaTypeType)refURI);
  }
  pxVar1 = local_48;
  pxVar3 = xmlSchemaFormatQName(&local_40,refName,(xmlChar *)name);
  xmlSchemaPErrFull(local_38,(xmlNodePtr)ownerItem,0xbbc,XML_ERR_ERROR,file,line,(xmlChar *)0x0,
                    (xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff80,
                    "%s, attribute \'%s\': The QName value \'%s\' does not resolve to a(n) %s.\n",
                    pxVar1,ownerElem,pxVar3,pxVar2,0);
  if (local_48 != (xmlChar *)0x0) {
    (*xmlFree)(local_48);
    local_48 = (xmlChar *)0x0;
  }
  if (local_40 != (xmlChar *)0x0) {
    (*xmlFree)(local_40);
  }
  return;
}

Assistant:

static void
xmlSchemaPResCompAttrErr(xmlSchemaParserCtxtPtr ctxt,
			 xmlParserErrors error,
			 xmlSchemaBasicItemPtr ownerItem,
			 xmlNodePtr ownerElem,
			 const char *name,
			 const xmlChar *refName,
			 const xmlChar *refURI,
			 xmlSchemaTypeType refType,
			 const char *refTypeStr)
{
    xmlChar *des = NULL, *strA = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, ownerItem, ownerElem);
    if (refTypeStr == NULL)
	refTypeStr = (const char *) xmlSchemaItemTypeToStr(refType);
    xmlSchemaPErrExt(ctxt, ownerElem, error,
	    NULL, NULL, NULL,
	    "%s, attribute '%s': The QName value '%s' does not resolve to a(n) "
	    "%s.\n", BAD_CAST des, BAD_CAST name,
	    xmlSchemaFormatQName(&strA, refURI, refName),
	    BAD_CAST refTypeStr, NULL);
    FREE_AND_NULL(des)
    FREE_AND_NULL(strA)
}